

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_float_push_back(ImVector_float *self,float v)

{
  int iVar1;
  float *__dest;
  int iVar2;
  int iVar3;
  
  iVar1 = self->Size;
  if (iVar1 == self->Capacity) {
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    iVar3 = iVar1 + 1;
    if (iVar1 + 1 < iVar2) {
      iVar3 = iVar2;
    }
    __dest = (float *)ImGui::MemAlloc((long)iVar3 << 2);
    if (self->Data != (float *)0x0) {
      memcpy(__dest,self->Data,(long)self->Size << 2);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar3;
    iVar1 = self->Size;
  }
  else {
    __dest = self->Data;
  }
  __dest[iVar1] = v;
  self->Size = self->Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImVector_float_push_back(ImVector_float* self,const float v)
{
    return self->push_back(v);
}